

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

void backward(lzma_coder_conflict9 *coder,uint32_t *len_res,uint32_t *back_res,uint32_t cur)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  uint32_t back_cur;
  uint32_t pos_prev;
  uint32_t back_mem;
  uint32_t pos_mem;
  uint32_t cur_local;
  uint32_t *back_res_local;
  uint32_t *len_res_local;
  lzma_coder_conflict9 *coder_local;
  
  pos_prev = coder->opts[cur].pos_prev;
  back_cur = coder->opts[cur].back_prev;
  coder->opts_end_index = cur;
  back_mem = cur;
  do {
    if ((coder->opts[back_mem].prev_1_is_literal & 1U) != 0) {
      make_literal(coder->opts + pos_prev);
      coder->opts[pos_prev].pos_prev = pos_prev - 1;
      if ((coder->opts[back_mem].prev_2 & 1U) != 0) {
        coder->opts[pos_prev - 1].prev_1_is_literal = false;
        coder->opts[pos_prev - 1].pos_prev = coder->opts[back_mem].pos_prev_2;
        coder->opts[pos_prev - 1].back_prev = coder->opts[back_mem].back_prev_2;
      }
    }
    uVar1 = coder->opts[pos_prev].back_prev;
    uVar2 = coder->opts[pos_prev].pos_prev;
    coder->opts[pos_prev].back_prev = back_cur;
    coder->opts[pos_prev].pos_prev = back_mem;
    back_mem = pos_prev;
    bVar3 = pos_prev != 0;
    back_cur = uVar1;
    pos_prev = uVar2;
  } while (bVar3);
  coder->opts_current_index = coder->opts[0].pos_prev;
  *len_res = coder->opts[0].pos_prev;
  *back_res = coder->opts[0].back_prev;
  return;
}

Assistant:

static void
backward(lzma_coder *LZMA_RESTRICT coder, uint32_t *LZMA_RESTRICT len_res,
		uint32_t *LZMA_RESTRICT back_res, uint32_t cur)
{
	uint32_t pos_mem = coder->opts[cur].pos_prev;
	uint32_t back_mem = coder->opts[cur].back_prev;

	coder->opts_end_index = cur;

	do {
		const uint32_t pos_prev = pos_mem;
		const uint32_t back_cur = back_mem;

		if (coder->opts[cur].prev_1_is_literal) {
			make_literal(&coder->opts[pos_mem]);
			coder->opts[pos_mem].pos_prev = pos_mem - 1;

			if (coder->opts[cur].prev_2) {
				coder->opts[pos_mem - 1].prev_1_is_literal
						= false;
				coder->opts[pos_mem - 1].pos_prev
						= coder->opts[cur].pos_prev_2;
				coder->opts[pos_mem - 1].back_prev
						= coder->opts[cur].back_prev_2;
			}
		}

		back_mem = coder->opts[pos_prev].back_prev;
		pos_mem = coder->opts[pos_prev].pos_prev;

		coder->opts[pos_prev].back_prev = back_cur;
		coder->opts[pos_prev].pos_prev = cur;
		cur = pos_prev;

	} while (cur != 0);

	coder->opts_current_index = coder->opts[0].pos_prev;
	*len_res = coder->opts[0].pos_prev;
	*back_res = coder->opts[0].back_prev;

	return;
}